

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

conditional_t<std::is_same_v<char32_t,_char>,_const_std::basic_string<char32_t>_&,_std::basic_string<char32_t>_>
* ptc::anon_unknown_4::StringConverter<char32_t>
            (conditional_t<std::is_same_v<char32_t,_char>,_const_std::basic_string<char32_t>_&,_std::basic_string<char32_t>_>
             *__return_storage_ptr__,string *input_str)

{
  int iVar1;
  string *input_str_local;
  
  if ((anonymous_namespace)::StringConverter<char32_t>(std::__cxx11::string_const&)::
      converter_32_t_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 StringConverter<char32_t>(std::__cxx11::string_const&)::
                                 converter_32_t_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::
      wstring_convert<std::codecvt_utf8_utf16<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
      ::wstring_convert(&(anonymous_namespace)::
                         StringConverter<char32_t>(std::__cxx11::string_const&)::
                         converter_32_t_abi_cxx11_);
      __cxa_atexit(std::__cxx11::
                   wstring_convert<std::codecvt_utf8_utf16<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
                   ::~wstring_convert,
                   &(anonymous_namespace)::StringConverter<char32_t>(std::__cxx11::string_const&)::
                    converter_32_t_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           StringConverter<char32_t>(std::__cxx11::string_const&)::
                           converter_32_t_abi_cxx11_);
    }
  }
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,
               &(anonymous_namespace)::StringConverter<char32_t>(std::__cxx11::string_const&)::
                converter_32_t_abi_cxx11_,input_str);
  return __return_storage_ptr__;
}

Assistant:

std::conditional_t<std::is_same_v<CharT, char>, const std::basic_string<CharT>&, std::basic_string<CharT>>
    StringConverter( const std::string& input_str )
     {
      if constexpr( std::is_same_v <CharT, char> ) 
       {
        return input_str;
       }
      else if constexpr( std::is_same_v <CharT, wchar_t> )
       {
        static std::wstring_convert <std::codecvt_utf8_utf16 <wchar_t>> converter_wchar_t;
        return converter_wchar_t.from_bytes( input_str );
       }
      #ifndef __APPLE__
      #if ( __cplusplus >= 202002L )
      else if constexpr( std::is_same_v <CharT, char8_t> )
       {
        return reinterpret_cast <const char8_t*>( input_str.c_str() );
       }
      #endif
      else if constexpr( std::is_same_v <CharT, char16_t> )
       {
        static std::wstring_convert <std::codecvt_utf8_utf16 <char16_t>, char16_t> converter_16_t;
        return converter_16_t.from_bytes( input_str );
       } 
      else if constexpr( std::is_same_v <CharT, char32_t> )
       {
        static std::wstring_convert <std::codecvt_utf8_utf16 <char32_t>, char32_t> converter_32_t;
        return converter_32_t.from_bytes( input_str );
       }
      #endif
      else 
       {
        return StringConverter<CharT>( "" );
       }